

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar4 == '\0') {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/block.cc"
                  ,0x90,"virtual void leveldb::Block::Iter::Prev()");
  }
  uVar1 = this->current_;
  uVar6 = this->restart_index_;
  while( true ) {
    uVar5 = GetRestartPoint(this,uVar6);
    uVar6 = this->restart_index_;
    if (uVar5 < uVar1) break;
    if (uVar6 == 0) {
      this->current_ = this->restarts_;
      this->restart_index_ = this->num_restarts_;
      goto LAB_00a4d212;
    }
    uVar6 = uVar6 - 1;
    this->restart_index_ = uVar6;
  }
  SeekToRestartPoint(this,uVar6);
  do {
    bVar3 = ParseNextKey(this);
    if (!bVar3) break;
  } while ((uint)((*(int *)&(this->value_).data_ + (int)(this->value_).size_) - *(int *)&this->data_
                 ) < uVar1);
LAB_00a4d212:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }